

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_encode_tiles_row_mt(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_COMP *cpi_00;
  long in_RDI;
  bool bVar5;
  int in_stack_0000000c;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_col;
  int tile_row;
  _Bool alloc_tile_data;
  _Bool alloc_row_mt_mem;
  int num_workers;
  int max_sb_cols_in_tile;
  int max_sb_rows_in_tile;
  int *thread_id_to_tile_id;
  int sb_rows_in_frame;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  int in_stack_00000154;
  AV1_COMMON *in_stack_00000158;
  MultiThreadInfo *in_stack_00000160;
  AV1_COMMON *in_stack_ffffffffffffff88;
  int local_70;
  int16_t *in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar7;
  int mi_col_end;
  int alloc_row_ctx;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffffd0;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x9ae98);
  iVar1 = *(int *)(in_RDI + 0x42020);
  iVar2 = *(int *)(in_RDI + 0x42024);
  iVar3 = get_sb_rows_in_frame((AV1_COMMON *)(in_RDI + 0x3bf80));
  xd = (MACROBLOCKD *)&cpi_00->enc_quant_dequant_params;
  alloc_row_ctx = 0;
  mi_col_end = 0;
  local_70 = *(int *)(in_RDI + 0x9ae5c);
  compute_max_sb_rows_cols
            ((AV1_COMMON *)(in_RDI + 0x3bf80),(int *)&stack0xffffffffffffffc4,
             (int *)&stack0xffffffffffffffc0);
  bVar5 = true;
  if ((((*(int *)((long)&cpi_00->ppi + 4) == iVar1) && (bVar5 = true, *(int *)&cpi_00->ppi == iVar2)
       ) && (bVar5 = true, *(int *)&cpi_00->field_0x8 == alloc_row_ctx)) &&
     (bVar5 = true, *(int *)&cpi_00->field_0xc == mi_col_end + -1)) {
    bVar5 = *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x10] + 4) != iVar3;
  }
  if (*(int *)(in_RDI + 0x71320) < iVar1 * iVar2) {
    av1_alloc_tile_data((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if (bVar5) {
    row_mt_mem_alloc((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),(int)((ulong)xd >> 0x20),
                     (int)xd,alloc_row_ctx);
  }
  if (*(int *)(in_RDI + 0x9ae48) <= local_70) {
    local_70 = *(int *)(in_RDI + 0x9ae48);
  }
  lpf_pipeline_mt_init((AV1_COMP *)row_mt_sync,in_stack_0000000c);
  av1_init_tile_data(cpi_00);
  memset(xd,0xff,0x100);
  memset(*(void **)(cpi_00->enc_quant_dequant_params).quants.y_quant[0x10],0,(long)iVar3 << 2);
  *(undefined1 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x10] + 6) = 0;
  for (iVar7 = 0; iVar6 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), iVar7 < iVar2;
      iVar7 = iVar7 + 1) {
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      in_stack_ffffffffffffffa0 =
           (AV1_COMP *)(*(long *)(in_RDI + 0x71318) + (long)(iVar7 * iVar1 + iVar6) * 0x5d10);
      in_stack_ffffffffffffff98 =
           (in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.u_quant_fp[0xcc] + 4;
      memset(*(void **)((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.u_quant_fp
                        [0xcd] + 4),0xff,(long)alloc_row_ctx << 2);
      *(int *)(in_stack_ffffffffffffff98 + 0x12) =
           ((TileInfo *)&in_stack_ffffffffffffffa0->ppi)->mi_row_start;
      *(undefined4 *)(in_stack_ffffffffffffff98 + 0x14) = 0;
      iVar4 = av1_get_intrabc_extra_top_right_sb_delay(in_stack_ffffffffffffff88);
      *(int *)(in_stack_ffffffffffffff98 + 0xe) = iVar4;
      av1_inter_mode_data_init((TileDataEnc *)in_stack_ffffffffffffffa0);
      av1_zero_above_context
                ((AV1_COMMON *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),xd,alloc_row_ctx,mi_col_end
                 ,local_70);
    }
  }
  assign_tile_to_thread(&xd->mi_row,iVar1 * iVar2,local_70);
  prepare_enc_workers((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),(AVxWorkerHook)xd,
                      alloc_row_ctx);
  launch_workers((MultiThreadInfo *)in_stack_ffffffffffffffa0,iVar6);
  sync_enc_workers(in_stack_00000160,in_stack_00000158,in_stack_00000154);
  if (*(int *)(in_RDI + 0x41ed8) != 0) {
    update_delta_lf_for_row_mt(cpi_00);
  }
  accumulate_counters_enc_workers(in_stack_ffffffffffffffa0,iVar6);
  return;
}

Assistant:

void av1_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int sb_rows_in_frame = get_sb_rows_in_frame(cm);
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int max_sb_rows_in_tile = 0, max_sb_cols_in_tile = 0;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  compute_max_sb_rows_cols(cm, &max_sb_rows_in_tile, &max_sb_cols_in_tile);
  const bool alloc_row_mt_mem =
      (enc_row_mt->allocated_tile_cols != tile_cols ||
       enc_row_mt->allocated_tile_rows != tile_rows ||
       enc_row_mt->allocated_rows != max_sb_rows_in_tile ||
       enc_row_mt->allocated_cols != (max_sb_cols_in_tile - 1) ||
       enc_row_mt->allocated_sb_rows != sb_rows_in_frame);
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_sb_rows_in_tile, max_sb_cols_in_tile,
                     cpi->oxcf.algo_cfg.cdf_update_mode);
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  lpf_pipeline_mt_init(cpi, num_workers);

  av1_init_tile_data(cpi);

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  memset(enc_row_mt->num_tile_cols_done, 0,
         sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows_in_frame);
  enc_row_mt->row_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_sb_rows_in_tile);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;
      row_mt_sync->intrabc_extra_top_right_sb_delay =
          av1_get_intrabc_extra_top_right_sb_delay(cm);

      av1_inter_mode_data_init(this_tile);
      av1_zero_above_context(cm, &cpi->td.mb.e_mbd,
                             this_tile->tile_info.mi_col_start,
                             this_tile->tile_info.mi_col_end, tile_row);
    }
  }

  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  prepare_enc_workers(cpi, enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  if (cm->delta_q_info.delta_lf_present_flag) update_delta_lf_for_row_mt(cpi);
  accumulate_counters_enc_workers(cpi, num_workers);
}